

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O1

void fallbackSort(UInt32 *fmap,UInt32 *eclass,UInt32 *bhtab,Int32 nblock,Int32 verb)

{
  undefined4 uVar1;
  UInt32 UVar2;
  bool bVar3;
  byte bVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint *puVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  UInt32 UVar21;
  int iVar22;
  long lVar23;
  UInt32 *pUVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  Int32 zztmp_1;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  Int32 stackLo [100];
  Int32 ftab [257];
  Int32 ftabCopy [256];
  ulong local_bb0;
  uint local_b68 [99];
  uint auStack_9dc [101];
  int local_848 [260];
  int local_438 [258];
  
  memset(local_848,0,0x404);
  uVar34 = (ulong)(uint)nblock;
  if (0 < nblock) {
    uVar9 = 0;
    do {
      local_848[*(byte *)((long)eclass + uVar9)] = local_848[*(byte *)((long)eclass + uVar9)] + 1;
      uVar9 = uVar9 + 1;
    } while (uVar34 != uVar9);
  }
  memcpy(local_438,local_848,0x400);
  lVar10 = 1;
  do {
    local_848[0] = local_848[0] + local_848[lVar10];
    local_848[lVar10] = local_848[0];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x101);
  if (0 < nblock) {
    uVar9 = 0;
    do {
      iVar15 = local_848[*(byte *)((long)eclass + uVar9)];
      local_848[*(byte *)((long)eclass + uVar9)] = iVar15 + -1;
      fmap[(long)iVar15 + -1] = (UInt32)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar34 != uVar9);
  }
  if (-0x40 < nblock) {
    iVar15 = nblock + 0x1f;
    if (-1 < nblock) {
      iVar15 = nblock;
    }
    iVar27 = -1;
    if (-1 < iVar15 >> 5) {
      iVar27 = iVar15 >> 5;
    }
    memset(bhtab,0,(ulong)(iVar27 + 1) * 4 + 4);
  }
  lVar10 = 0;
  do {
    bhtab[local_848[lVar10] >> 5] =
         bhtab[local_848[lVar10] >> 5] | 1 << ((byte)local_848[lVar10] & 0x1f);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x100);
  iVar15 = 0;
  do {
    bhtab[nblock + iVar15 >> 5] =
         bhtab[nblock + iVar15 >> 5] | 1 << ((byte)(nblock + iVar15) & 0x1f);
    iVar27 = nblock + 1 + iVar15;
    bVar4 = (byte)iVar27 & 0x1f;
    bhtab[iVar27 >> 5] = bhtab[iVar27 >> 5] & (-2 << bVar4 | 0xfffffffeU >> 0x20 - bVar4);
    iVar15 = iVar15 + 2;
  } while (iVar15 != 0x40);
  iVar15 = 1;
  do {
    if (0 < nblock) {
      uVar9 = 0;
      uVar14 = 0;
      do {
        if ((bhtab[uVar9 >> 5 & 0x7ffffff] >> ((uint)uVar9 & 0x1f) & 1) != 0) {
          uVar14 = uVar9 & 0xffffffff;
        }
        eclass[(int)(((int)(fmap[uVar9] - iVar15) >> 0x1f & nblock) + (fmap[uVar9] - iVar15))] =
             (UInt32)uVar14;
        uVar9 = uVar9 + 1;
      } while (uVar34 != uVar9);
    }
    uVar32 = 0;
    iVar27 = 0;
LAB_0010d2d0:
    uVar16 = uVar32 - 1;
    iVar13 = uVar32 - 0x20;
    do {
      uVar33 = uVar32;
      iVar6 = iVar13;
      uVar8 = uVar16;
      uVar19 = 1 << ((byte)uVar33 & 0x1f) & bhtab[(int)uVar33 >> 5];
      if ((uVar33 & 0x1f) == 0) break;
      uVar16 = uVar8 + 1;
      iVar13 = iVar6 + 1;
      uVar32 = uVar33 + 1;
    } while (uVar19 != 0);
    if (uVar19 != 0) {
      do {
        uVar33 = uVar8;
        iVar6 = iVar6 + 0x20;
        uVar8 = uVar33 + 0x20;
      } while (bhtab[iVar6 >> 5] == 0xffffffff);
      do {
        uVar33 = uVar33 + 1;
      } while ((bhtab[(int)uVar33 >> 5] >> (uVar33 & 0x1f) & 1) != 0);
    }
    if ((int)uVar33 <= nblock) {
      uVar19 = uVar33 - 1;
      uVar16 = uVar19;
      uVar8 = uVar33;
      iVar13 = uVar33 - 0x20;
      do {
        iVar6 = iVar13;
        uVar32 = uVar8;
        uVar25 = uVar16;
        uVar20 = 1 << (sbyte)(uVar32 & 0x1f) & bhtab[(int)uVar32 >> 5];
        if ((uVar32 & 0x1f) == 0) break;
        uVar16 = uVar25 + 1;
        uVar8 = uVar32 + 1;
        iVar13 = iVar6 + 1;
      } while (uVar20 == 0);
      if (uVar20 == 0) {
        do {
          uVar32 = uVar25;
          iVar6 = iVar6 + 0x20;
          uVar25 = uVar32 + 0x20;
        } while (bhtab[iVar6 >> 5] == 0);
        do {
          uVar32 = uVar32 + 1;
        } while ((bhtab[(int)uVar32 >> 5] >> (uVar32 & 0x1f) & 1) == 0);
      }
      if (nblock < (int)uVar32) goto LAB_0010d7e2;
      if ((int)uVar33 < (int)uVar32) {
        iVar27 = (iVar27 - uVar33) + uVar32 + 1;
        auStack_9dc[1] = uVar19;
        local_b68[0] = uVar32 - 1;
        local_bb0 = 1;
        uVar16 = 0;
        do {
          uVar9 = local_bb0 & 0xffffffff;
          while( true ) {
            if (0x62 < (long)uVar9) {
              bz_internal_error(0x3ec);
            }
            local_bb0 = uVar9 - 1;
            uVar8 = auStack_9dc[uVar9];
            lVar10 = (long)(int)uVar8;
            uVar25 = local_b68[uVar9 - 1];
            uVar14 = (ulong)uVar25;
            if (9 < (int)(uVar25 - uVar8)) break;
            if (uVar25 != uVar8) {
              lVar17 = (long)(int)uVar25;
              if ((int)uVar8 <= (int)(uVar25 - 4) && 3 < (int)(uVar25 - uVar8)) {
                lVar18 = lVar17;
                lVar28 = (long)(int)(uVar25 - 4);
                do {
                  UVar21 = fmap[lVar28];
                  iVar13 = (int)lVar28;
                  if (lVar28 <= lVar17 + -4) {
                    uVar20 = eclass[(int)UVar21];
                    lVar5 = lVar18;
                    lVar23 = lVar28;
                    do {
                      lVar11 = lVar5;
                      iVar13 = (int)lVar23;
                      if (uVar20 <= eclass[fmap[lVar11]]) goto LAB_0010d4ab;
                      fmap[iVar13] = fmap[lVar11];
                      lVar5 = lVar11 + 4;
                      lVar23 = lVar11;
                    } while (lVar11 + 4 <= lVar17);
                    iVar13 = (int)lVar11;
                  }
LAB_0010d4ab:
                  fmap[iVar13] = UVar21;
                  lVar18 = lVar18 + -1;
                  bVar3 = lVar10 < lVar28;
                  lVar28 = lVar28 + -1;
                } while (bVar3);
              }
              if ((int)uVar8 < (int)uVar25) {
                iVar13 = -uVar25;
                pUVar24 = fmap + lVar17;
                iVar6 = 1;
                lVar18 = lVar17;
                do {
                  UVar21 = fmap[lVar18 + -1];
                  iVar22 = (int)lVar18;
                  if (lVar18 <= lVar17) {
                    uVar8 = eclass[(int)UVar21];
                    lVar28 = 0;
                    do {
                      if (uVar8 <= eclass[pUVar24[lVar28]]) {
                        iVar22 = (int)lVar28 - iVar13;
                        break;
                      }
                      pUVar24[lVar28 + -1] = pUVar24[lVar28];
                      lVar28 = lVar28 + 1;
                      iVar22 = uVar25 + 1;
                    } while (iVar6 != (int)lVar28);
                  }
                  lVar18 = lVar18 + -1;
                  fmap[(long)iVar22 + -1] = UVar21;
                  iVar13 = iVar13 + 1;
                  iVar6 = iVar6 + 1;
                  pUVar24 = pUVar24 + -1;
                } while (lVar10 < lVar18);
              }
            }
            bVar3 = (long)uVar9 < 2;
            uVar9 = local_bb0;
            if (bVar3) goto LAB_0010d78a;
          }
          uVar16 = uVar16 * 0x1dc5 + 1 & 0x7fff;
          uVar20 = uVar8;
          if ((uVar16 % 3 != 0) && (uVar20 = uVar25, uVar16 % 3 == 1)) {
            uVar20 = (int)(uVar25 + uVar8) >> 1;
          }
          UVar21 = eclass[fmap[(int)uVar20]];
          uVar31 = (ulong)uVar8;
          uVar30 = uVar14;
          uVar20 = uVar8;
LAB_0010d58e:
          uVar29 = (uint)uVar14;
          if ((int)uVar20 <= (int)uVar29) {
            uVar31 = (ulong)(int)uVar31;
            uVar26 = uVar20;
            do {
              lVar17 = (long)(int)uVar26 + -1;
              uVar20 = uVar26;
              while( true ) {
                uVar7 = fmap[lVar17 + 1];
                UVar2 = eclass[uVar7];
                if (UVar2 == UVar21) break;
                if (UVar2 != UVar21 && (int)UVar21 <= (int)UVar2) goto LAB_0010d5f0;
                uVar20 = uVar20 + 1;
                lVar17 = lVar17 + 1;
                if ((int)uVar29 <= lVar17) {
                  if ((int)uVar26 <= (int)uVar29) {
                    uVar26 = uVar29;
                  }
                  uVar20 = uVar26 + 1;
                  goto LAB_0010d5f0;
                }
              }
              fmap[lVar17 + 1] = fmap[uVar31];
              fmap[uVar31] = uVar7;
              uVar31 = uVar31 + 1;
              uVar26 = uVar20 + 1;
            } while ((int)uVar20 < (int)uVar29);
            uVar20 = uVar20 + 1;
          }
LAB_0010d5f0:
          lVar17 = (long)(int)uVar20;
          if ((int)uVar20 <= (int)uVar29) {
            uVar30 = (ulong)(int)uVar30;
            do {
              uVar29 = (uint)uVar14;
              lVar18 = (long)(int)uVar29 + 1;
              while( true ) {
                uVar26 = fmap[lVar18 + -1];
                iVar13 = (int)uVar14;
                if (eclass[uVar26] == UVar21) break;
                if ((int)eclass[uVar26] < (int)UVar21) {
                  UVar2 = fmap[lVar17];
                  fmap[lVar17] = uVar26;
                  fmap[lVar18 + -1] = UVar2;
                  uVar20 = uVar20 + 1;
                  uVar14 = (ulong)(iVar13 - 1);
                  goto LAB_0010d58e;
                }
                lVar18 = lVar18 + -1;
                uVar14 = (ulong)(iVar13 - 1);
                if (lVar18 <= lVar17) {
                  if (lVar17 <= (int)uVar29) {
                    uVar29 = uVar20;
                  }
                  uVar29 = uVar29 - 1;
                  goto LAB_0010d681;
                }
              }
              fmap[lVar18 + -1] = fmap[uVar30];
              fmap[uVar30] = uVar26;
              uVar30 = uVar30 - 1;
              uVar14 = (ulong)(iVar13 - 1);
            } while ((int)uVar20 < iVar13);
            uVar29 = iVar13 - 1;
          }
LAB_0010d681:
          iVar13 = (int)uVar30;
          uVar26 = (uint)uVar31;
          if ((int)uVar26 <= iVar13) {
            iVar6 = uVar20 - uVar26;
            if ((int)(uVar26 - uVar8) < (int)(uVar20 - uVar26)) {
              iVar6 = uVar26 - uVar8;
            }
            if (0 < iVar6) {
              iVar22 = iVar6 + 1;
              lVar18 = 0;
              do {
                uVar1 = *(undefined4 *)((long)fmap + lVar18 + lVar10 * 4);
                *(undefined4 *)((long)fmap + lVar18 + lVar10 * 4) =
                     *(undefined4 *)((long)fmap + lVar18 + (long)(int)(uVar20 - iVar6) * 4);
                *(undefined4 *)((long)fmap + lVar18 + (long)(int)(uVar20 - iVar6) * 4) = uVar1;
                lVar18 = lVar18 + 4;
                iVar22 = iVar22 + -1;
              } while (1 < iVar22);
            }
            iVar22 = iVar13 - uVar29;
            iVar6 = uVar25 - iVar13;
            if (iVar22 <= (int)(uVar25 - iVar13)) {
              iVar6 = iVar22;
            }
            if (0 < iVar6) {
              iVar13 = iVar6 + 1;
              pUVar24 = fmap;
              do {
                UVar21 = pUVar24[lVar17];
                pUVar24[lVar17] = pUVar24[(long)(int)(uVar25 - iVar6) + 1];
                pUVar24[(long)(int)(uVar25 - iVar6) + 1] = UVar21;
                pUVar24 = pUVar24 + 1;
                iVar13 = iVar13 + -1;
              } while (1 < iVar13);
            }
            uVar29 = ~uVar26 + uVar8 + uVar20;
            uVar7 = (uVar25 - iVar22) + 1;
            if ((int)(uVar25 - uVar7) < (int)(~uVar26 + uVar20)) {
              local_b68[local_bb0] = uVar29;
              uVar8 = uVar7;
              uVar29 = uVar25;
            }
            else {
              auStack_9dc[uVar9] = uVar7;
            }
            auStack_9dc[(uVar9 & 0xffffffff) + 1] = uVar8;
            local_b68[uVar9 & 0xffffffff] = uVar29;
            local_bb0 = (ulong)((int)uVar9 + 1);
          }
        } while (0 < (int)local_bb0);
LAB_0010d78a:
        if ((int)uVar33 <= (int)uVar32) {
          puVar12 = fmap + (int)uVar19;
          UVar21 = 0xffffffff;
          do {
            UVar2 = eclass[*puVar12];
            if (UVar21 != UVar2) {
              bhtab[(int)uVar19 >> 5] = bhtab[(int)uVar19 >> 5] | 1 << ((byte)uVar19 & 0x1f);
              UVar21 = UVar2;
            }
            uVar19 = uVar19 + 1;
            puVar12 = puVar12 + 1;
          } while (uVar32 != uVar19);
        }
      }
      goto LAB_0010d2d0;
    }
LAB_0010d7e2:
    iVar15 = iVar15 * 2;
    if ((nblock < iVar15) || (iVar27 == 0)) {
      if (0 < nblock) {
        uVar9 = 0;
        lVar10 = 0;
        do {
          lVar10 = (long)(int)lVar10 + -1;
          do {
            lVar17 = lVar10 + 1;
            lVar10 = lVar10 + 1;
          } while (local_438[lVar17] == 0);
          local_438[lVar10] = local_438[lVar17] + -1;
          *(char *)((long)eclass + (ulong)fmap[uVar9]) = (char)lVar10;
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar34);
        if (0xff < lVar10) {
          bz_internal_error(0x3ed);
          return;
        }
      }
      return;
    }
  } while( true );
}

Assistant:

static
void fallbackSort ( UInt32* fmap, 
                    UInt32* eclass, 
                    UInt32* bhtab,
                    Int32   nblock,
                    Int32   verb )
{
   Int32 ftab[257];
   Int32 ftabCopy[256];
   Int32 H, i, j, k, l, r, cc, cc1;
   Int32 nNotDone;
   Int32 nBhtab;
   UChar* eclass8 = (UChar*)eclass;

   /*--
      Initial 1-char radix sort to generate
      initial fmap and initial BH bits.
   --*/
   if (verb >= 4)
      VPrintf0 ( "        bucket sorting ...\n" );
   for (i = 0; i < 257;    i++) ftab[i] = 0;
   for (i = 0; i < nblock; i++) ftab[eclass8[i]]++;
   for (i = 0; i < 256;    i++) ftabCopy[i] = ftab[i];
   for (i = 1; i < 257;    i++) ftab[i] += ftab[i-1];

   for (i = 0; i < nblock; i++) {
      j = eclass8[i];
      k = ftab[j] - 1;
      ftab[j] = k;
      fmap[k] = i;
   }

   nBhtab = 2 + (nblock / 32);
   for (i = 0; i < nBhtab; i++) bhtab[i] = 0;
   for (i = 0; i < 256; i++) SET_BH(ftab[i]);

   /*--
      Inductively refine the buckets.  Kind-of an
      "exponential radix sort" (!), inspired by the
      Manber-Myers suffix array construction algorithm.
   --*/

   /*-- set sentinel bits for block-end detection --*/
   for (i = 0; i < 32; i++) { 
      SET_BH(nblock + 2*i);
      CLEAR_BH(nblock + 2*i + 1);
   }

   /*-- the log(N) loop --*/
   H = 1;
   while (1) {

      if (verb >= 4) 
         VPrintf1 ( "        depth %6d has ", H );

      j = 0;
      for (i = 0; i < nblock; i++) {
         if (ISSET_BH(i)) j = i;
         k = fmap[i] - H; if (k < 0) k += nblock;
         eclass[k] = j;
      }

      nNotDone = 0;
      r = -1;
      while (1) {

	 /*-- find the next non-singleton bucket --*/
         k = r + 1;
         while (ISSET_BH(k) && UNALIGNED_BH(k)) k++;
         if (ISSET_BH(k)) {
            while (WORD_BH(k) == 0xffffffff) k += 32;
            while (ISSET_BH(k)) k++;
         }
         l = k - 1;
         if (l >= nblock) break;
         while (!ISSET_BH(k) && UNALIGNED_BH(k)) k++;
         if (!ISSET_BH(k)) {
            while (WORD_BH(k) == 0x00000000) k += 32;
            while (!ISSET_BH(k)) k++;
         }
         r = k - 1;
         if (r >= nblock) break;

         /*-- now [l, r] bracket current bucket --*/
         if (r > l) {
            nNotDone += (r - l + 1);
            fallbackQSort3 ( fmap, eclass, l, r );

            /*-- scan bucket and generate header bits-- */
            cc = -1;
            for (i = l; i <= r; i++) {
               cc1 = eclass[fmap[i]];
               if (cc != cc1) { SET_BH(i); cc = cc1; };
            }
         }
      }

      if (verb >= 4) 
         VPrintf1 ( "%6d unresolved strings\n", nNotDone );

      H *= 2;
      if (H > nblock || nNotDone == 0) break;
   }

   /*-- 
      Reconstruct the original block in
      eclass8 [0 .. nblock-1], since the
      previous phase destroyed it.
   --*/
   if (verb >= 4)
      VPrintf0 ( "        reconstructing block ...\n" );
   j = 0;
   for (i = 0; i < nblock; i++) {
      while (ftabCopy[j] == 0) j++;
      ftabCopy[j]--;
      eclass8[fmap[i]] = (UChar)j;
   }
   AssertH ( j < 256, 1005 );
}